

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *other)

{
  ulong nbCols;
  ulong nbRows;
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  Index innerSize;
  Index outerSize;
  long lVar6;
  long lVar7;
  Index col;
  long lVar8;
  undefined8 *puVar9;
  Index row;
  long lVar10;
  
  nbCols = *(ulong *)(*(long *)other + 8);
  nbRows = *(ulong *)(*(long *)other + 0x10);
  if ((nbCols != 0 && nbRows != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816((long)nbCols),0) < (long)nbRows)) {
    puVar9 = (undefined8 *)
             __cxa_allocate_exception(8,other,SUB168(auVar5 % SEXT816((long)nbCols),0));
    *puVar9 = operator_delete;
    __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((long)(nbCols | nbRows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbCols * nbRows,nbRows,nbCols);
  lVar1 = *(long *)(this + 8);
  plVar2 = *(long **)other;
  if ((lVar1 == plVar2[2]) && (lVar3 = *(long *)(this + 0x10), lVar3 == plVar2[1])) {
    lVar4 = *(long *)this;
    if (0 < lVar3) {
      lVar6 = 0;
      lVar8 = 0;
      lVar7 = lVar4;
      do {
        if (0 < lVar1) {
          puVar9 = (undefined8 *)(*plVar2 + lVar6);
          lVar10 = 0;
          do {
            *(undefined8 *)(lVar7 + lVar10 * 8) = *puVar9;
            lVar10 = lVar10 + 1;
            puVar9 = puVar9 + lVar3;
          } while (lVar1 != lVar10);
        }
        lVar8 = lVar8 + 1;
        lVar7 = lVar7 + lVar1 * 8;
        lVar6 = lVar6 + 8;
      } while (lVar8 != lVar3);
    }
    if ((lVar4 != 0) && (*plVar2 == lVar4)) {
      __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Transpose.h"
                    ,0x18a,
                    "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, MightHaveTransposeAliasing = true]"
                   );
    }
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }